

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O2

char * upb_MtDecoder_Parse(upb_MtDecoder *d,char *ptr,size_t len,void *fields,size_t field_size,
                          uint16_t *field_count,upb_SubCounts *sub_counts)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  byte bVar3;
  _Bool _Var4;
  uint uVar5;
  upb_MiniTableField *puVar6;
  upb_SubCounts *puVar7;
  upb_MiniTableField *puVar8;
  uint16_t uVar9;
  uint uVar10;
  uint uVar11;
  byte *pbVar12;
  ulong uVar13;
  char cVar14;
  byte bVar15;
  char *pcVar16;
  byte *pbVar17;
  byte bVar18;
  byte *pbVar19;
  byte *pbVar20;
  bool bVar21;
  bool bVar22;
  uint local_74;
  uint16_t *local_70;
  ulong local_68;
  uint32_t skip;
  uint32_t local_5c;
  upb_MiniTableField *local_58;
  upb_MiniTableField *local_50;
  upb_SubCounts *local_48;
  size_t local_40;
  byte *local_38;
  
  bVar21 = d->table != (upb_MiniTable *)0x0;
  pbVar12 = (byte *)(ptr + len);
  (d->base).end = (char *)pbVar12;
  local_48 = (upb_SubCounts *)&sub_counts->subenum_count;
  uVar11 = 0;
  local_68 = 0;
  puVar6 = (upb_MiniTableField *)0x0;
  local_70 = field_count;
  local_40 = field_size;
  do {
    if (pbVar12 <= ptr) {
      if (bVar21) {
        d->table->dense_below_dont_copy_me__upb_internal_use_only =
             (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
      }
      return (char *)(byte *)ptr;
    }
    pbVar20 = (byte *)ptr + 1;
    bVar15 = *ptr;
    uVar13 = (ulong)bVar15;
    if ((char)bVar15 < 'J') {
      if ((d->table == (upb_MiniTable *)0x0) && (puVar6 != (upb_MiniTableField *)0x0)) {
        return (char *)(byte *)ptr;
      }
      *field_count = *field_count + 1;
      uVar5 = (int)local_68 + 1;
      local_68 = (ulong)uVar5;
      ((upb_MiniTableField *)fields)->number_dont_copy_me__upb_internal_use_only = uVar5;
      cVar14 = (d->platform != kUpb_MiniTablePlatform_32Bit) * '\x02' + '\x01';
      bVar3 = _upb_FromBase92(bVar15);
      if (bVar15 < 0x36) {
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = '\x02';
        ((upb_MiniTableField *)fields)->offset_dont_copy_me__upb_internal_use_only = 1;
        if ((bVar3 & 0xfe) != 0x10) {
          if (0x12 < bVar3) goto LAB_00250cfe;
          bVar15 = upb_MiniTable_SetField_kUpb_EncodedToFieldRep[bVar3] << 6 | 2;
          ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar15;
          goto LAB_00250bb8;
        }
        bVar15 = cVar14 * '@' | 2;
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar15;
        bVar18 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar3];
      }
      else {
        bVar3 = bVar3 - 0x14;
        bVar15 = cVar14 * '@' + 1;
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar15;
        ((upb_MiniTableField *)fields)->offset_dont_copy_me__upb_internal_use_only = 0;
        if (0x12 < bVar3) {
LAB_00250cfe:
          uVar13 = (ulong)(uint)(int)(char)bVar3;
          pcVar16 = "Invalid field type: %d";
LAB_00250d9c:
          upb_MdDecoder_ErrorJmp(&d->base,pcVar16,uVar13);
        }
LAB_00250bb8:
        bVar18 = 5;
        if (bVar3 == 0xc) {
LAB_00250bc5:
          bVar15 = bVar15 | 0x10;
          ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar15;
        }
        else if (bVar3 == 0xf) {
          bVar18 = 0xc;
          if ((uVar11 & 1) == 0) goto LAB_00250bc5;
          bVar18 = 9;
        }
        else {
          bVar18 = "\x01\x02\a\x06\x0f\x10\x05\r\x11\x03\x04\x12\x0e\b\f\t\n\v\x0e"[bVar3];
        }
      }
      ((upb_MiniTableField *)fields)->descriptortype_dont_copy_me__upb_internal_use_only = bVar18;
      _Var4 = upb_MtDecoder_FieldIsPackable((upb_MiniTableField *)fields);
      if ((uVar11 & 2) != 0 && _Var4) {
        ((upb_MiniTableField *)fields)->mode_dont_copy_me__upb_internal_use_only = bVar15 | 4;
      }
      puVar7 = sub_counts;
      if (((bVar18 & 0xfe) == 10) || (uVar9 = 0xffff, puVar7 = local_48, bVar18 == 0xe)) {
        uVar9 = puVar7->submsg_count;
        puVar7->submsg_count = uVar9 + 1;
      }
      ((upb_MiniTableField *)fields)->submsg_index_dont_copy_me__upb_internal_use_only = uVar9;
      puVar8 = (upb_MiniTableField *)
               ((long)&((upb_MiniTableField *)fields)->number_dont_copy_me__upb_internal_use_only +
               local_40);
      puVar6 = (upb_MiniTableField *)fields;
      ptr = (char *)pbVar20;
    }
    else {
      puVar8 = (upb_MiniTableField *)fields;
      if ((byte)(bVar15 + 0xb4) < 0x10) {
        ptr = upb_MdDecoder_DecodeBase92Varint(&d->base,(char *)pbVar20,bVar15,'L','[',&local_74);
        uVar5 = local_74;
        if (puVar6 == (upb_MiniTableField *)0x0) {
          uVar11 = local_74;
          if (d->table == (upb_MiniTable *)0x0) {
            pcVar16 = "Extensions cannot have message modifiers";
LAB_00250d65:
            upb_MdDecoder_ErrorJmp(&d->base,pcVar16);
          }
        }
        else {
          if ((local_74 & 1) != 0) {
            _Var4 = upb_MtDecoder_FieldIsPackable(puVar6);
            if (!_Var4) {
              uVar13 = (ulong)puVar6->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Cannot flip packed on unpackable field %u";
              goto LAB_00250d9c;
            }
            puVar6->mode_dont_copy_me__upb_internal_use_only =
                 puVar6->mode_dont_copy_me__upb_internal_use_only ^ 4;
          }
          if ((uVar5 & 8) != 0) {
            if ((puVar6->descriptortype_dont_copy_me__upb_internal_use_only != '\f') ||
               ((puVar6->mode_dont_copy_me__upb_internal_use_only & 0x10) == 0)) {
              upb_MdDecoder_ErrorJmp
                        (&d->base,"Cannot flip ValidateUtf8 on field %u, type=%d, mode=%d",
                         (ulong)puVar6->number_dont_copy_me__upb_internal_use_only);
            }
            puVar6->descriptortype_dont_copy_me__upb_internal_use_only = '\t';
            puVar6->mode_dont_copy_me__upb_internal_use_only =
                 puVar6->mode_dont_copy_me__upb_internal_use_only & 0xef;
          }
          field_count = local_70;
          if ((uVar5 & 6) != 0) {
            if (puVar6->offset_dont_copy_me__upb_internal_use_only != 1) {
              uVar13 = (ulong)puVar6->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Invalid modifier(s) for repeated field %u";
              goto LAB_00250d9c;
            }
            if ((uVar5 & 6) == 6) {
              uVar13 = (ulong)puVar6->number_dont_copy_me__upb_internal_use_only;
              pcVar16 = "Field %u cannot be both singular and required";
              goto LAB_00250d9c;
            }
            if ((uVar5 & 4) != 0) {
              if ((puVar6->descriptortype_dont_copy_me__upb_internal_use_only & 0xfe) == 10) {
                uVar13 = (ulong)puVar6->number_dont_copy_me__upb_internal_use_only;
                pcVar16 = "Field %u cannot be a singular submessage";
                goto LAB_00250d9c;
              }
              puVar6->offset_dont_copy_me__upb_internal_use_only = 0;
            }
            if ((uVar5 & 2) != 0) {
              puVar6->offset_dont_copy_me__upb_internal_use_only = 2;
            }
          }
        }
        if ((uVar11 & 4) != 0) {
          puVar1 = &d->table->ext_dont_copy_me__upb_internal_use_only;
          *puVar1 = *puVar1 | 1;
        }
      }
      else if (bVar15 == 0x5e) {
        local_50 = puVar6;
        if (d->table == (upb_MiniTable *)0x0) {
          pcVar16 = "Extensions cannot have oneofs.";
          goto LAB_00250d65;
        }
        uVar5 = 0xffff;
        uVar13 = 0;
        local_58 = (upb_MiniTableField *)fields;
        while( true ) {
          if (pbVar12 <= pbVar20) break;
          bVar15 = *pbVar20;
          pbVar20 = pbVar20 + 1;
          if (bVar15 != 0x7c) {
            if (bVar15 != 0x7e) {
              local_38 = (byte *)upb_MdDecoder_DecodeBase92Varint
                                           (&d->base,(char *)pbVar20,bVar15,' ','b',&local_5c);
              uVar2 = local_5c;
              puVar6 = upb_MiniTable_FindFieldByNumber(d->table,local_5c);
              if (puVar6 == (upb_MiniTableField *)0x0) {
                pcVar16 = "Couldn\'t add field number %u to oneof, no such field number.";
              }
              else {
                if (puVar6->offset_dont_copy_me__upb_internal_use_only == 1) {
                  uVar10 = (uint)(puVar6->mode_dont_copy_me__upb_internal_use_only >> 6);
                  pbVar12 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar13;
                  pbVar19 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar13;
                  bVar22 = d->platform != kUpb_MiniTablePlatform_32Bit;
                  pbVar20 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar10;
                  if (!bVar22) {
                    pbVar20 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar10;
                  }
                  pbVar17 = &upb_MtDecoder_AlignOfRep_kRepToAlign32 + uVar10;
                  if (bVar22) {
                    pbVar17 = &upb_MtDecoder_AlignOfRep_kRepToAlign64 + uVar10;
                  }
                  bVar15 = *pbVar17;
                  if (bVar22) {
                    pbVar19 = pbVar12;
                    pbVar12 = &upb_MtDecoder_SizeOfRep_kRepToSize64 + uVar13;
                  }
                  bVar3 = *pbVar19;
                  if ((*pbVar12 < *pbVar20) || ((*pbVar20 == *pbVar12 && (bVar3 < bVar15)))) {
                    uVar13 = (ulong)uVar10;
                    if (bVar15 < bVar3) {
                      __assert_fail("new_align >= current_align",
                                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                    ,0x15f,
                                    "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                   );
                    }
                  }
                  else if (bVar3 < bVar15) {
                    __assert_fail("current_align >= new_align",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/decode.c"
                                  ,0x162,
                                  "const char *upb_MtDecoder_DecodeOneofField(upb_MtDecoder *, const char *, char, upb_OneOfLayoutItem *)"
                                 );
                  }
                  puVar6->offset_dont_copy_me__upb_internal_use_only = (uint16_t)uVar5;
                  uVar5 = (int)(((long)puVar6 - (long)d->fields) / 0xc) + 3;
                  fields = local_58;
                  pbVar20 = local_38;
                  goto LAB_00250aee;
                }
                pcVar16 = "Cannot add repeated, required, or singular field %u to oneof.";
              }
              uVar13 = (ulong)uVar2;
              goto LAB_00250d9c;
            }
            upb_MtDecoder_PushOneof(d,(upb_OneOfLayoutItem)((int)uVar13 << 0x10 | uVar5 & 0xffff));
            uVar5 = 0xffff;
          }
LAB_00250aee:
          pbVar12 = (byte *)(d->base).end;
        }
        upb_MtDecoder_PushOneof(d,(upb_OneOfLayoutItem)((int)uVar13 << 0x10 | uVar5 & 0xffff));
        puVar8 = (upb_MiniTableField *)fields;
        field_count = local_70;
        puVar6 = local_50;
        ptr = (char *)pbVar20;
      }
      else {
        if (0x1f < (byte)(bVar15 + 0xa1)) {
          pcVar16 = "Invalid char: %c";
          goto LAB_00250d9c;
        }
        if (bVar21) {
          d->table->dense_below_dont_copy_me__upb_internal_use_only =
               (uint8_t)d->table->field_count_dont_copy_me__upb_internal_use_only;
          bVar21 = false;
        }
        ptr = upb_MdDecoder_DecodeBase92Varint(&d->base,(char *)pbVar20,bVar15,'_','~',&skip);
        local_68 = (ulong)(((int)local_68 + skip) - 1);
      }
    }
    pbVar12 = (byte *)(d->base).end;
    fields = puVar8;
  } while( true );
}

Assistant:

static const char* upb_MtDecoder_Parse(upb_MtDecoder* d, const char* ptr,
                                       size_t len, void* fields,
                                       size_t field_size, uint16_t* field_count,
                                       upb_SubCounts* sub_counts) {
  uint64_t msg_modifiers = 0;
  uint32_t last_field_number = 0;
  upb_MiniTableField* last_field = NULL;
  bool need_dense_below = d->table != NULL;

  d->base.end = UPB_PTRADD(ptr, len);

  while (ptr < d->base.end) {
    char ch = *ptr++;
    if (ch <= kUpb_EncodedValue_MaxField) {
      if (!d->table && last_field) {
        // For extensions, consume only a single field and then return.
        return --ptr;
      }
      upb_MiniTableField* field = fields;
      *field_count += 1;
      fields = (char*)fields + field_size;
      field->UPB_PRIVATE(number) = ++last_field_number;
      last_field = field;
      upb_MiniTable_SetField(d, ch, field, msg_modifiers, sub_counts);
    } else if (kUpb_EncodedValue_MinModifier <= ch &&
               ch <= kUpb_EncodedValue_MaxModifier) {
      ptr = upb_MtDecoder_ParseModifier(d, ptr, ch, last_field, &msg_modifiers);
      if (msg_modifiers & kUpb_MessageModifier_IsExtendable) {
        d->table->UPB_PRIVATE(ext) |= kUpb_ExtMode_Extendable;
      }
    } else if (ch == kUpb_EncodedValue_End) {
      if (!d->table) {
        upb_MdDecoder_ErrorJmp(&d->base, "Extensions cannot have oneofs.");
      }
      ptr = upb_MtDecoder_DecodeOneofs(d, ptr);
    } else if (kUpb_EncodedValue_MinSkip <= ch &&
               ch <= kUpb_EncodedValue_MaxSkip) {
      if (need_dense_below) {
        d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
        need_dense_below = false;
      }
      uint32_t skip;
      ptr = upb_MdDecoder_DecodeBase92Varint(&d->base, ptr, ch,
                                             kUpb_EncodedValue_MinSkip,
                                             kUpb_EncodedValue_MaxSkip, &skip);
      last_field_number += skip;
      last_field_number--;  // Next field seen will increment.
    } else {
      upb_MdDecoder_ErrorJmp(&d->base, "Invalid char: %c", ch);
    }
  }

  if (need_dense_below) {
    d->table->UPB_PRIVATE(dense_below) = d->table->UPB_PRIVATE(field_count);
  }

  return ptr;
}